

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.c
# Opt level: O0

void propose_letter(char *word,char *attempted_letters,char attempt,uint8_t *n_errs)

{
  char *pcVar1;
  char local_2a [2];
  uint8_t *puStack_28;
  char attempt_str [2];
  uint8_t *n_errs_local;
  char attempt_local;
  char *attempted_letters_local;
  char *word_local;
  
  if ((('@' < attempt) && (attempt < '[')) &&
     (puStack_28 = n_errs, pcVar1 = strchr(attempted_letters,(int)attempt), pcVar1 == (char *)0x0))
  {
    local_2a[1] = 0;
    local_2a[0] = attempt;
    strcat(attempted_letters,local_2a);
    pcVar1 = strchr(word,(int)attempt);
    if (pcVar1 == (char *)0x0) {
      *puStack_28 = *puStack_28 + '\x01';
    }
  }
  return;
}

Assistant:

void propose_letter(const char* word, char attempted_letters[27], char attempt, uint8_t* n_errs) {
  if (attempt < 'A' || attempt > 'Z') return;
  if (strchr(attempted_letters, attempt) != NULL) return;
  char attempt_str[2] = {attempt, 0};
  strcat(attempted_letters, attempt_str);
  if (strchr(word, attempt) == NULL) {
    *n_errs += 1;
  }
}